

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool ORPG::Utils::print_file(string *type)

{
  pointer pcVar1;
  byte bVar2;
  string screen_disp;
  string local_58;
  string local_38;
  
  bVar2 = Core::QUIET_FLAG;
  if (Core::QUIET_FLAG == 0) {
    pcVar1 = (type->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + type->_M_string_length);
    get_display_screen(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    puts(local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool print_file(string type) {
            if(Core::QUIET_FLAG) return false;

            string screen_disp = get_display_screen(type);
            printf("%s\n", screen_disp.c_str());

            return true;
        }